

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIO.h
# Opt level: O0

string * RelativeURLToLocalPath
                   (string *__return_storage_ptr__,FileURL *inFileURL,string *inRelativeURL)

{
  FileURL local_60;
  FileURL local_40;
  string *local_20;
  string *inRelativeURL_local;
  FileURL *inFileURL_local;
  
  local_20 = inRelativeURL;
  inRelativeURL_local = (string *)inFileURL;
  inFileURL_local = (FileURL *)__return_storage_ptr__;
  FileURL::FileURL(&local_60,inRelativeURL);
  FileURL::InterpretFrom(&local_40,&local_60,(FileURL *)inRelativeURL_local);
  FileURLToLocalPath_abi_cxx11_(__return_storage_ptr__,&local_40);
  FileURL::~FileURL(&local_40);
  FileURL::~FileURL(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static string RelativeURLToLocalPath(const FileURL& inFileURL,const string& inRelativeURL)
{
    return FileURLToLocalPath(FileURL(inRelativeURL).InterpretFrom(inFileURL));
}